

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

entity * __thiscall grid::removeFromBoard(grid *this,entity *entityToDelete)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = entity::getSourceX(entityToDelete);
  iVar2 = entity::getSourceY(entityToDelete);
  iVar3 = entity::getDirection(entityToDelete);
  iVar4 = entity::getSize(entityToDelete);
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      this->board[iVar1][iVar2] = (entity *)0x0;
      iVar1 = iVar1 + this->directionOperations[iVar3][0];
      iVar2 = iVar2 + this->directionOperations[iVar3][1];
      iVar4 = iVar4 + 1;
      iVar5 = entity::getSize(entityToDelete);
    } while (iVar4 < iVar5);
  }
  return entityToDelete;
}

Assistant:

entity *grid::removeFromBoard(entity *entityToDelete) {

    int x= entityToDelete->getSourceX();
    int y = entityToDelete->getSourceY();
    int direction = entityToDelete->getDirection();
    for (int i = 0; i < entityToDelete->getSize(); ++i) {
        board[x][y] = nullptr;
        x += directionOperations[direction][0];
        y += directionOperations[direction][1];
    }

    return entityToDelete;
}